

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O1

bool myutils::create_cmd_sock_pair(SOCKET *server,SOCKET *client)

{
  int __fd;
  in_addr_t iVar1;
  int iVar2;
  SOCKET SVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  socklen_t addr_len;
  int v;
  sockaddr_in addr;
  string ip;
  allocator local_71;
  socklen_t local_70 [2];
  undefined1 local_68 [8];
  char acStack_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  __fd = socket(2,1,0);
  if (__fd == -1) {
    return false;
  }
  local_70[1] = 1;
  setsockopt(__fd,1,2,local_70 + 1,4);
  acStack_60[0] = '\0';
  acStack_60[1] = '\0';
  acStack_60[2] = '\0';
  acStack_60[3] = '\0';
  acStack_60[4] = '\0';
  acStack_60[5] = '\0';
  acStack_60[6] = '\0';
  acStack_60[7] = '\0';
  local_68._0_2_ = 2;
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  iVar1 = inet_addr("127.0.0.1");
  local_68 = (undefined1  [8])(CONCAT44(iVar1,local_68._0_4_) & 0xffffffff0000ffff);
  iVar2 = bind(__fd,(sockaddr *)local_68,0x10);
  if (iVar2 != 0) {
    close(__fd);
    return false;
  }
  listen(__fd,1);
  local_70[0] = 0x10;
  getsockname(__fd,(sockaddr *)local_68,local_70);
  pcVar5 = inet_ntoa((in_addr)local_68._4_4_);
  std::__cxx11::string::string((string *)local_50,pcVar5,&local_71);
  SVar3 = connect_socket(local_50[0],
                         (uint)(ushort)(local_68._2_2_ << 8 | (ushort)local_68._2_2_ >> 8));
  *client = SVar3;
  if (SVar3 != 0) {
    iVar2 = accept(__fd,(sockaddr *)local_68,local_70);
    *server = iVar2;
    if (iVar2 != 0) {
      uVar4 = fcntl(iVar2,3,0);
      fcntl(iVar2,4,(ulong)(uVar4 | 0x800));
      bVar6 = true;
      close(__fd);
      goto LAB_0013f23e;
    }
    close(__fd);
    __fd = *client;
  }
  close(__fd);
  bVar6 = false;
LAB_0013f23e:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return bVar6;
}

Assistant:

bool create_cmd_sock_pair(SOCKET* server, SOCKET* client)
    {
        SOCKET sock = socket(AF_INET, SOCK_STREAM, 0);
        if (sock == INVALID_SOCKET) return false;

        int v = 1;
        setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&v, sizeof(v));

        sockaddr_in addr;
        memset(&addr, 0, sizeof(addr));
        addr.sin_family = AF_INET;
        addr.sin_addr.s_addr = inet_addr("127.0.0.1");
        addr.sin_port = 0;

        if (::bind(sock, (sockaddr*)&addr, sizeof(addr)) != 0) {
            //LOG(FATAL) << "Error binding socket, ec: " << WSAGetLastError();
            closesocket(sock);
            return false;
        }

        listen(sock, 1);
        socklen_t addr_len = sizeof(addr);
        getsockname(sock, (sockaddr*)&addr, &addr_len);
        ////LOG(INFO) << "socks turnel server listen at " << inet_ntoa(addr.sin_addr) << ":" << ntohs(addr.sin_port);

        string ip = inet_ntoa(addr.sin_addr);
        int port = ntohs(addr.sin_port);
        *client = myutils::connect_socket(ip.c_str(), port);
        //CHECK(*client != INVALID_SOCKET);
        if (!*client) {
            closesocket(sock);
            return false;
        }

        *server = accept(sock, (sockaddr*)&addr, &addr_len);
        if (!*server) {
            closesocket(sock);
            closesocket(*client);
            return false;
        }

        myutils::set_socket_nonblock(*server, true);
        closesocket(sock);

        return true;
    }